

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1.c
# Opt level: O2

void htt1p_finish(http_s *h)

{
  FIOBJ o;
  
  o = headers2str(h,0);
  if (o != 0) {
    fiobj_send_free(*(intptr_t *)((h->private_data).flag + 0x30),o);
  }
  http1_after_finish(h);
  return;
}

Assistant:

static void htt1p_finish(http_s *h) {
  FIOBJ packet = headers2str(h, 0);
  if (packet)
    fiobj_send_free((handle2pr(h)->p.uuid), packet);
  else {
    // fprintf(stderr, "WARNING: invalid call to `htt1p_finish`\n");
  }
  http1_after_finish(h);
}